

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O2

int __thiscall
tchecker::while_statement_t::clone
          (while_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  while_statement_t *this_00;
  shared_ptr<const_tchecker::statement_t> stmt_clone;
  shared_ptr<const_tchecker::expression_t> condition_clone;
  
  iVar1 = (*((this->_condition).
             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_expression_t[2])();
  std::__shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::expression_t,void>
            ((__shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2> *)
             &condition_clone,(expression_t *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*((this->_stmt).
             super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_statement_t[2])();
  std::__shared_ptr<tchecker::statement_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::statement_t,void>
            ((__shared_ptr<tchecker::statement_t_const,(__gnu_cxx::_Lock_policy)2> *)&stmt_clone,
             (statement_t *)CONCAT44(extraout_var_00,iVar1));
  this_00 = (while_statement_t *)operator_new(0x28);
  while_statement_t(this_00,&condition_clone,&stmt_clone);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stmt_clone.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&condition_clone.
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::while_statement_t * while_statement_t::clone() const
{
  std::shared_ptr<tchecker::expression_t const> condition_clone{_condition->clone()};
  std::shared_ptr<tchecker::statement_t const> stmt_clone{_stmt->clone()};
  return new tchecker::while_statement_t(condition_clone, stmt_clone);
}